

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(SubjectSetRegister *this)

{
  _Rb_tree_header *p_Var1;
  key_type local_2c;
  shared_ptr<bidfx_public_api::price::pixie::EditionData> local_28;
  
  p_Var1 = &(this->subject_state_)._M_t._M_impl.super__Rb_tree_header;
  (this->subject_state_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subject_state_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  (this->subject_state_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subject_state_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subject_state_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header;
  (this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c = 0;
  std::make_shared<bidfx_public_api::price::pixie::EditionData>();
  std::
  map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
  ::insert_or_assign<std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>
            ((map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
              *)&this->subject_set_cache_,&local_2c,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.
              super___shared_ptr<bidfx_public_api::price::pixie::EditionData,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

SubjectSetRegister::SubjectSetRegister()
{
    subject_set_cache_.insert_or_assign(0, std::make_shared<EditionData>());
}